

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O0

void __thiscall
QRhiImplementation::updateLayoutDesc(QRhiImplementation *this,QRhiShaderResourceBindings *srb)

{
  long lVar1;
  Type TVar2;
  Type TVar3;
  Data *this_00;
  long in_RSI;
  long in_FS_OFFSET;
  back_insert_iterator<QList<unsigned_int>_> unaff_retaddr;
  Data *d;
  QRhiShaderResourceBinding *b;
  const_iterator __end1;
  const_iterator __begin1;
  add_const_t<QVarLengthArray<QRhiShaderResourceBinding,_12LL>_> *__range1;
  back_insert_iterator<QList<unsigned_int>_> layoutDescAppender;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  Data *local_40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)(in_RSI + 0xd68) = 0;
  QList<unsigned_int>::clear
            ((QList<unsigned_int> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  std::back_inserter<QList<unsigned_int>>
            ((QList<unsigned_int> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  local_40 = &QVLABase<QRhiShaderResourceBinding>::begin
                        ((QVLABase<QRhiShaderResourceBinding> *)0x691c2a)->d;
  this_00 = &QVLABase<QRhiShaderResourceBinding>::end
                       ((QVLABase<QRhiShaderResourceBinding> *)
                        CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))->d;
  for (; local_40 != this_00; local_40 = local_40 + 1) {
    TVar3 = local_40->binding;
    TVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_40->stage);
    TVar3 = TVar3 ^ TVar2 ^ local_40->type;
    TVar2 = QRhiShaderResourceBinding::Data::arraySize(local_40);
    *(ulong *)(in_RSI + 0xd68) = (ulong)(TVar3 ^ TVar2) ^ *(ulong *)(in_RSI + 0xd68);
    QRhiShaderResourceBinding::Data::serialize<std::back_insert_iterator<QList<unsigned_int>>>
              (this_00,unaff_retaddr);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRhiImplementation::updateLayoutDesc(QRhiShaderResourceBindings *srb)
{
    srb->m_layoutDescHash = 0;
    srb->m_layoutDesc.clear();
    auto layoutDescAppender = std::back_inserter(srb->m_layoutDesc);
    for (const QRhiShaderResourceBinding &b : std::as_const(srb->m_bindings)) {
        const QRhiShaderResourceBinding::Data *d = &b.d;
        srb->m_layoutDescHash ^= uint(d->binding) ^ uint(d->stage) ^ uint(d->type)
            ^ uint(d->arraySize());
        layoutDescAppender = d->serialize(layoutDescAppender);
    }
}